

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

ps_seg_t * allphone_search_seg_next(ps_seg_t *seg)

{
  ps_segfuncs_t *ppVar1;
  
  ppVar1 = (ps_segfuncs_t *)(seg[1].vt)->seg_free;
  seg[1].vt = ppVar1;
  if (ppVar1 == (ps_segfuncs_t *)0x0) {
    ckd_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    allphone_search_fill_iter(seg,(phseg_t *)ppVar1->seg_next);
  }
  return seg;
}

Assistant:

static ps_seg_t *
allphone_search_seg_next(ps_seg_t * seg)
{
    phseg_iter_t *itor = (phseg_iter_t *) seg;
    phseg_t *phseg;

    itor->seg = itor->seg->next;
    
    if (itor->seg == NULL) {
	allphone_search_seg_free(seg);
        return NULL;
    }
    phseg = gnode_ptr(itor->seg);
    allphone_search_fill_iter(seg, phseg);

    return seg;
}